

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ClockingDeclarationSyntax::setChild
          (ClockingDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_004b3f20 + *(int *)(&DAT_004b3f20 + index * 4)))();
  return;
}

Assistant:

void ClockingDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: globalOrDefault = child.token(); return;
        case 2: clocking = child.token(); return;
        case 3: blockName = child.token(); return;
        case 4: at = child.token(); return;
        case 5: event = child.node() ? &child.node()->as<EventExpressionSyntax>() : nullptr; return;
        case 6: semi = child.token(); return;
        case 7: items = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 8: endClocking = child.token(); return;
        case 9: endBlockName = child.node() ? &child.node()->as<NamedBlockClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}